

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprc_inout(lys_ypr_ctx *pctx,lysc_node_action_inout *inout,ly_bool *flag)

{
  ly_stmt substmt;
  lysc_node *local_58;
  uint local_3c;
  lysc_node *local_30;
  lysc_node *data;
  uint64_t u;
  ly_bool *flag_local;
  lysc_node_action_inout *inout_local;
  lys_ypr_ctx *pctx_local;
  
  if (inout->child != (lysc_node *)0x0) {
    ypr_open((pctx->field_0).field_0.out,flag);
    if (((pctx->field_0).field_0.options & 2) == 0) {
      local_3c = (uint)(pctx->field_0).field_0.level << 1;
    }
    else {
      local_3c = 0;
    }
    ly_print_((pctx->field_0).field_0.out,"\n%*s%s {\n",(ulong)local_3c,"",
              (inout->field_0).node.name);
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level + 1;
    substmt = lyplg_ext_nodetype2stmt((inout->field_0).node.nodetype);
    yprc_extension_instances(pctx,substmt,'\0',(inout->field_0).node.exts,(ly_bool *)0x0);
    data = (lysc_node *)0x0;
    while( true ) {
      if (inout->musts == (lysc_must *)0x0) {
        local_58 = (lysc_node *)0x0;
      }
      else {
        local_58 = (lysc_node *)inout->musts[-1].exts;
      }
      if (local_58 <= data) break;
      yprc_must(pctx,inout->musts + (long)data,(ly_bool *)0x0);
      data = (lysc_node *)((long)&data->nodetype + 1);
    }
    if (((pctx->field_0).field_0.options & 0x10) == 0) {
      for (local_30 = inout->child; local_30 != (lysc_node *)0x0; local_30 = local_30->next) {
        yprc_node(pctx,local_30);
      }
    }
    (pctx->field_0).field_0.level = (pctx->field_0).field_0.level - 1;
    ypr_close(pctx,'\x01');
  }
  return;
}

Assistant:

static void
yprc_inout(struct lys_ypr_ctx *pctx, const struct lysc_node_action_inout *inout, ly_bool *flag)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_node *data;

    if (!inout->child) {
        /* input/output is empty */
        return;
    }
    ypr_open(pctx->out, flag);

    ly_print_(pctx->out, "\n%*s%s {\n", INDENT, inout->name);
    LEVEL++;

    yprc_extension_instances(pctx, lyplg_ext_nodetype2stmt(inout->nodetype), 0, inout->exts, NULL);
    LY_ARRAY_FOR(inout->musts, u) {
        yprc_must(pctx, &inout->musts[u], NULL);
    }

    if (!(pctx->options & LYS_PRINT_NO_SUBSTMT)) {
        LY_LIST_FOR(inout->child, data) {
            yprc_node(pctx, data);
        }
    }

    LEVEL--;
    ypr_close(pctx, 1);
}